

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createMap.hpp
# Opt level: O2

map<int,_njoy::ENDFtk::tree::Section,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
* __thiscall
njoy::ENDFtk::tree::File::createMap<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (map<int,_njoy::ENDFtk::tree::Section,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
           *__return_storage_ptr__,File *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *position,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *end,long *lineNumber)

{
  _Rb_tree_header *p_Var1;
  int args_1;
  bool bVar2;
  size_type sVar3;
  undefined8 *puVar4;
  char *in_stack_ffffffffffffff38;
  StructureDivision division;
  undefined1 local_70 [64];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  end->_M_current = end->_M_current + -1;
  *(HEAD **)begin._M_current = head;
  StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&division,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)begin._M_current,position,(long *)end);
  args_1 = *(int *)((long)&(this->sections_)._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
  do {
    if ((((division.tail.fields._M_elems[2] == 0) || (division.tail.fields._M_elems[1] == 0)) ||
        (division.tail.fields._M_elems[0] == 0)) || (division.tail.fields._M_elems[1] != args_1)) {
      bVar2 = StructureDivision::isFend(&division);
      if (!bVar2) {
        *(HEAD **)begin._M_current = head;
        tools::Log::info<char_const*,int>("The FEND record for MF{} appears to be missing",args_1);
        tools::Log::info<char_const*,int,int,int,long>
                  ("Current position: MAT{} MF{} MT{} at line {}",division.tail.fields._M_elems[0],
                   division.tail.fields._M_elems[1],division.tail.fields._M_elems[2],
                   (long)end->_M_current);
      }
      return __return_storage_ptr__;
    }
    sVar3 = std::
            map<int,_njoy::ENDFtk::tree::Section,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
            ::count(__return_storage_ptr__,division.tail.fields._M_elems + 2);
    if (sVar3 != 0) {
      tools::Log::error<char_const*,int>
                ("Found a duplicate section for MT{}",division.tail.fields._M_elems[2]);
      tools::Log::info<char_const*,int,int,int,long>
                ("Current position: MAT{} MF{} MT{} at line {}",division.tail.fields._M_elems[0],
                 division.tail.fields._M_elems[1],division.tail.fields._M_elems[2],
                 (long)end->_M_current);
LAB_00139560:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = getenv;
      __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
    }
    Section::Section<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((Section *)local_70,(HEAD *)&division,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )head,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)begin._M_current,position,(long *)end);
    std::
    _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::Section>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::Section>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Section>>>
    ::_M_emplace_unique<int&,njoy::ENDFtk::tree::Section>
              ((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::Section>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::Section>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Section>>>
                *)__return_storage_ptr__,division.tail.fields._M_elems + 2,(Section *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x10));
    head = *(HEAD **)begin._M_current;
    if (position->_M_current <= head) {
      tools::Log::error<char_const*>(in_stack_ffffffffffffff38);
      goto LAB_00139560;
    }
    StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((StructureDivision *)local_70,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)begin._M_current,position,(long *)end);
    StructureDivision::operator=(&division,(StructureDivision *)local_70);
    do {
      bVar2 = StructureDivision::isSend(&division);
      if (!bVar2) break;
      head = *(HEAD **)begin._M_current;
      StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((StructureDivision *)local_70,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)begin._M_current,position,(long *)end);
      StructureDivision::operator=(&division,(StructureDivision *)local_70);
    } while (*begin._M_current < position->_M_current);
  } while( true );
}

Assistant:

static std::map< int, Section >
createMap
( const HEAD& head, BufferIterator begin,
  BufferIterator& position, const BufferIterator& end, long& lineNumber ){

  std::map< int, Section > sections;

  // read the first HEAD record (we need a structure division)
  --lineNumber;
  position = begin;
  auto division = StructureDivision( position, end, lineNumber );

  // continue reading sections for the same mf
  auto mf = head.MF();
  while ( division.isHead() && ( division.tail.MF() == mf ) ) {

    // check for duplicate mt
    if ( sections.count( division.tail.MT() ) ) {

      Log::error( "Found a duplicate section for MT{}", division.tail.MT() );
      Log::info( "Current position: MAT{} MF{} MT{} at line {}",
                 division.tail.MAT(), division.tail.MF(), division.tail.MT(),
                 lineNumber );
      throw std::exception();
    }

    // add the section
    sections.emplace( division.tail.MT(),
                      Section( asHead( division ),
                               begin, position, end, lineNumber ) );

    // check for end of stream
    if ( position >= end ) {

      Log::error( "Encountered the end of stream before a FEND record was found" );
      throw std::exception();
    }

    // skip any duplicate SEND records
    begin = position;
    division = StructureDivision( position, end, lineNumber );

    while ( division.isSend() ) {

      begin = position;
      division = StructureDivision( position, end, lineNumber );
      if ( position >= end ) {

        break;
      }
    }
  }

  // warn for missing FEND record
  if ( !division.isFend() ) {

    position = begin;
    Log::info( "The FEND record for MF{} appears to be missing", mf );
    Log::info( "Current position: MAT{} MF{} MT{} at line {}",
               division.tail.MAT(), division.tail.MF(), division.tail.MT(),
               lineNumber );
  }

  return sections;
}